

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O1

uint Lpk_ComputeSets_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t *vSets)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint Entry;
  uint uVar5;
  uint uVar6;
  Kit_DsdObj_t *pKVar7;
  uint uSupps [16];
  uint local_68 [16];
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  if ((uint)p->nNodes + (uint)uVar1 <= uVar4) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (uVar4 < uVar1) {
    pKVar7 = (Kit_DsdObj_t *)0x0;
  }
  else {
    pKVar7 = p->pNodes[(ulong)uVar4 - (ulong)uVar1];
  }
  if (pKVar7 == (Kit_DsdObj_t *)0x0) {
    uVar4 = 1 << ((byte)uVar4 & 0x1f);
  }
  else {
    uVar4 = (uint)*pKVar7 >> 6 & 7;
    if (uVar4 - 3 < 2) {
      if ((uint)*pKVar7 < 0x4000000) {
        uVar2 = (ulong)((uint)*pKVar7 >> 0x1a);
        uVar4 = 0;
      }
      else {
        uVar3 = 0;
        uVar4 = 0;
        do {
          uVar6 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)((long)&pKVar7[1].field_0x0 + uVar3 * 2),
                                      vSets);
          local_68[uVar3] = uVar6;
          uVar4 = uVar4 | uVar6;
          uVar3 = uVar3 + 1;
          uVar2 = (ulong)((uint)*pKVar7 >> 0x1a);
        } while (uVar3 < uVar2);
      }
      uVar6 = -1 << ((byte)uVar2 & 0x1f);
      if (uVar6 < 0xfffffffe) {
        uVar5 = 1;
        do {
          Entry = 0;
          if (0x3ffffff < (uint)*pKVar7) {
            uVar3 = 0;
            Entry = 0;
            do {
              if ((uVar5 >> ((uint)uVar3 & 0x1f) & 1) != 0) {
                Entry = Entry | local_68[uVar3];
              }
              uVar3 = uVar3 + 1;
            } while ((uint)*pKVar7 >> 0x1a != uVar3);
          }
          Vec_IntPush(vSets,Entry);
          uVar5 = uVar5 + 1;
        } while ((uVar6 ^ uVar5) != 0xffffffff);
      }
    }
    else {
      if (uVar4 != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                      ,0x55,"unsigned int Lpk_ComputeSets_rec(Kit_DsdNtk_t *, int, Vec_Int_t *)");
      }
      uVar4 = 0;
      if (0x3ffffff < (uint)*pKVar7) {
        uVar3 = 0;
        uVar4 = 0;
        do {
          uVar6 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)((long)&pKVar7[1].field_0x0 + uVar3 * 2),
                                      vSets);
          uVar4 = uVar4 | uVar6;
          Vec_IntPush(vSets,uVar6);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (uint)*pKVar7 >> 0x1a);
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned Lpk_ComputeSets_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t * vSets )
{
    unsigned i, iLitFanin, uSupport, uSuppCur;
    Kit_DsdObj_t * pObj;
    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return (1 << Abc_Lit2Var(iLit));
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        unsigned uSupps[16], Limit, s;
        uSupport = 0;
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            uSupps[i] = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
            uSupport |= uSupps[i];
        }
        // create all subsets, except empty and full
        Limit = (1 << pObj->nFans) - 1;
        for ( s = 1; s < Limit; s++ )
        {
            uSuppCur = 0;
            for ( i = 0; i < pObj->nFans; i++ )
                if ( s & (1 << i) )
                    uSuppCur |= uSupps[i];
            Vec_IntPush( vSets, uSuppCur );
        }
        return uSupport;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    // get the cumulative support of all fanins
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
    {
        uSuppCur  = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
        uSupport |= uSuppCur;
        Vec_IntPush( vSets, uSuppCur );
    }
    return uSupport;
}